

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
ising::dos::square::count(uint_t Lx,uint_t Ly)

{
  graph *pgVar1;
  size_t sVar2;
  range_error *this;
  graph *pgVar3;
  reference pvVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  uint_t cj;
  uint_t ci;
  uint_t b;
  uint_t energy;
  uint_t c;
  uint_t num_states;
  graph graph;
  unitcell unitcell;
  basis basis;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *dos;
  size_t in_stack_fffffffffffffe28;
  graph *in_stack_fffffffffffffe30;
  allocator_type *in_stack_fffffffffffffe38;
  value_type_conflict1 *in_stack_fffffffffffffe40;
  size_type in_stack_fffffffffffffe48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe50;
  ulong uVar5;
  double in_stack_fffffffffffffe70;
  double in_stack_fffffffffffffe78;
  size_t in_stack_fffffffffffffe88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pos;
  unitcell *this_00;
  ulong local_148;
  undefined8 in_stack_fffffffffffffec0;
  int tp;
  size_type __n;
  offset_t *in_stack_fffffffffffffec8;
  graph *pgVar6;
  size_t in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  unitcell *in_stack_fffffffffffffee0;
  boundary_t in_stack_ffffffffffffff24;
  span_t *in_stack_ffffffffffffff28;
  unitcell *in_stack_ffffffffffffff30;
  basis *in_stack_ffffffffffffff38;
  graph *in_stack_ffffffffffffff40;
  
  tp = (int)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  this_00 = (unitcell *)0x2;
  pos = in_RDI;
  lattice::basis::simple(in_stack_fffffffffffffe88);
  lattice::unitcell::unitcell((unitcell *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  lattice::coordinate(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  lattice::unitcell::add_site(this_00,(coordinate_t *)pos,(int)((ulong)in_RDI >> 0x20));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x102532);
  lattice::offset((long)in_stack_fffffffffffffe78,(long)in_stack_fffffffffffffe70);
  lattice::unitcell::add_bond
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8,tp);
  Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<long,__1,_1,_0,__1,_1> *)0x102577);
  lattice::offset((long)in_stack_fffffffffffffe78,(long)in_stack_fffffffffffffe70);
  lattice::unitcell::add_bond
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8,tp);
  Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<long,__1,_1,_0,__1,_1> *)0x1025bc);
  lattice::extent((size_t)in_stack_fffffffffffffe78,(size_t)in_stack_fffffffffffffe70);
  lattice::graph::graph
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
  Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<long,__1,__1,_0,__1,__1> *)0x102615);
  sVar2 = lattice::graph::num_bonds((graph *)0x102622);
  if (sVar2 < 0x40) {
    lattice::graph::num_bonds((graph *)0x102793);
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1027c5);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
               in_stack_fffffffffffffe38);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1027f0);
    sVar2 = lattice::graph::num_sites((graph *)0x1027fd);
    pgVar3 = (graph *)(long)(1 << ((byte)sVar2 & 0x1f));
    for (pgVar6 = (graph *)0x0; pgVar6 < pgVar3; pgVar6 = (graph *)((long)&pgVar6->dim_ + 1)) {
      __n = 0;
      local_148 = 0;
      while (uVar5 = local_148, sVar2 = lattice::graph::num_bonds((graph *)0x102870), uVar5 < sVar2)
      {
        pgVar1 = pgVar6;
        sVar2 = lattice::graph::source(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        in_stack_fffffffffffffe30 = pgVar1;
        uVar5 = (ulong)pgVar6 >> (sVar2 & 0x3f);
        pgVar6 = in_stack_fffffffffffffe30;
        sVar2 = lattice::graph::target(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        __n = ((ulong)((uVar5 & 1) != 0) ^
              (ulong)in_stack_fffffffffffffe30 >> ((byte)sVar2 & 0x3f) & 1) + __n;
        local_148 = local_148 + 1;
      }
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDI,__n);
      *pvVar4 = *pvVar4 + 1;
    }
    lattice::graph::~graph(in_stack_fffffffffffffe30);
    lattice::unitcell::~unitcell((unitcell *)in_stack_fffffffffffffe30);
    lattice::basis::~basis((basis *)0x102a0b);
    return pos;
  }
  this = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this,"Error: system size is too large\n");
  __cxa_throw(this,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

std::vector<uint_t> count(uint_t Lx, uint_t Ly) {
  auto basis = lattice::basis::simple(2);
  auto unitcell = lattice::unitcell(2);
  unitcell.add_site(lattice::coordinate(0, 0), 0);
  unitcell.add_bond(0, 0, lattice::offset(1, 0), 0);
  unitcell.add_bond(0, 0, lattice::offset(0, 1), 0);
  auto graph = lattice::graph(basis, unitcell, lattice::extent(Lx, Ly));
  if (graph.num_bonds() >= std::numeric_limits<uint_t>::digits)
    throw std::range_error("Error: system size is too large\n");
  
  std::vector<uint_t> dos(graph.num_bonds() + 1, 0);
  uint_t num_states = 1 << graph.num_sites();
  for (uint_t c = 0; c < num_states; ++c) {
    uint_t energy = 0;
    for (uint_t b = 0; b < graph.num_bonds(); ++b) {
      uint_t ci = (c >> graph.source(b)) & 1;
      uint_t cj = (c >> graph.target(b)) & 1;
      energy += (ci ^ cj);
    }
    ++dos[energy];
  }
  return dos;
}